

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::TestSpecParser::addPattern<Catch::TestSpec::NamePattern>(TestSpecParser *this)

{
  bool bVar1;
  NamePattern *this_00;
  Pattern *p;
  undefined1 local_60 [8];
  string token;
  Ptr<Catch::TestSpec::Pattern> pattern;
  
  std::__cxx11::string::substr((ulong)local_60,(ulong)&this->m_arg);
  token.field_2._8_8_ = &stack0xffffffffffffffd0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&token.field_2 + 8),"exclude:","");
  bVar1 = startsWith((string *)local_60,(string *)((long)&token.field_2 + 8));
  if ((undefined1 *)token.field_2._8_8_ != &stack0xffffffffffffffd0) {
    operator_delete((void *)token.field_2._8_8_);
  }
  if (bVar1) {
    this->m_exclusion = true;
    std::__cxx11::string::substr((ulong)((long)&token.field_2 + 8),(ulong)local_60);
    std::__cxx11::string::operator=((string *)local_60,(string *)(token.field_2._M_local_buf + 8));
    if ((undefined1 *)token.field_2._8_8_ != &stack0xffffffffffffffd0) {
      operator_delete((void *)token.field_2._8_8_);
    }
  }
  if (token._M_dataplus._M_p != (pointer)0x0) {
    this_00 = (NamePattern *)operator_new(0x40);
    TestSpec::NamePattern::NamePattern(this_00,(string *)local_60);
    token.field_2._8_8_ = this_00;
    (**(code **)(*(long *)&(this_00->super_Pattern).super_SharedImpl<Catch::IShared>.super_IShared +
                0x10))(this_00);
    if (this->m_exclusion == true) {
      p = (Pattern *)operator_new(0x18);
      (p->super_SharedImpl<Catch::IShared>).m_rc = 0;
      (p->super_SharedImpl<Catch::IShared>).super_IShared.super_NonCopyable._vptr_NonCopyable =
           (_func_int **)&PTR__ExcludedPattern_001800d8;
      p[1].super_SharedImpl<Catch::IShared>.super_IShared.super_NonCopyable._vptr_NonCopyable =
           (_func_int **)this_00;
      (**(code **)(*(long *)&(this_00->super_Pattern).super_SharedImpl<Catch::IShared>.super_IShared
                  + 0x10))(this_00);
      Ptr<Catch::TestSpec::Pattern>::operator=
                ((Ptr<Catch::TestSpec::Pattern> *)((long)&token.field_2 + 8),p);
    }
    std::
    vector<Catch::Ptr<Catch::TestSpec::Pattern>,_std::allocator<Catch::Ptr<Catch::TestSpec::Pattern>_>_>
    ::push_back(&(this->m_currentFilter).m_patterns,(value_type *)((long)&token.field_2 + 8));
    if (token.field_2._8_8_ != 0) {
      (**(code **)(*(long *)token.field_2._8_8_ + 0x18))();
    }
  }
  this->m_exclusion = false;
  this->m_mode = None;
  if (local_60 != (undefined1  [8])&token._M_string_length) {
    operator_delete((void *)local_60);
  }
  return;
}

Assistant:

void addPattern() {
			std::string token = subString();
			if (startsWith(token, "exclude:")) {
				m_exclusion = true;
				token = token.substr(8);
			}
			if (!token.empty()) {
				Ptr<TestSpec::Pattern> pattern = new T(token);
				if (m_exclusion)
					pattern = new TestSpec::ExcludedPattern(pattern);
				m_currentFilter.m_patterns.push_back(pattern);
			}
			m_exclusion = false;
			m_mode = None;
		}